

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

vector<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_> * __thiscall
kratos::PortPackedVisitor::structs
          (vector<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_>
           *__return_storage_ptr__,PortPackedVisitor *this)

{
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  undefined1 local_60 [8];
  PackedStructGraph g;
  
  local_60 = (undefined1  [8])&g.nodes_._M_h._M_rehash_policy._M_next_resize;
  g.nodes_._M_h._M_buckets = (__buckets_ptr)0x1;
  g.nodes_._M_h._M_bucket_count = 0;
  g.nodes_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  g.nodes_._M_h._M_element_count._0_4_ = 0x3f800000;
  g.nodes_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  g.nodes_._M_h._M_rehash_policy._4_4_ = 0;
  g.nodes_._M_h._M_rehash_policy._M_next_resize = 0;
  p_Var1 = (this->structs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->structs_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    do {
      add_struct((PackedStructGraph *)local_60,(PackedStruct *)0x0,*(PackedStruct **)(p_Var1 + 2));
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  PackedStructGraph::get_structs(__return_storage_ptr__,(PackedStructGraph *)local_60);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::PackedStructNode>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::PackedStructNode>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::PackedStructNode>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::PackedStructNode>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_60);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] std::vector<const PackedStruct*> structs() const {
        PackedStructGraph g;
        for (auto const& [_, s] : structs_) {
            add_struct(&g, nullptr, s);
        }

        return g.get_structs();
    }